

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slhdsa_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_45c6fa::SLHDSATest_BasicSignVerify_Test::TestBody
          (SLHDSATest_BasicSignVerify_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2180;
  Message local_2178;
  int local_2170;
  int local_216c;
  undefined1 local_2168 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_2138;
  Message local_2130;
  int local_2124;
  undefined1 local_2120 [8];
  AssertionResult gtest_ar__1;
  Message local_2108;
  int local_2100;
  int local_20fc;
  undefined1 local_20f8 [8];
  AssertionResult gtest_ar_2;
  Message local_20e0;
  int local_20d8;
  int local_20d4;
  undefined1 local_20d0 [8];
  AssertionResult gtest_ar_1;
  Message local_20b8;
  int local_20b0;
  int local_20ac;
  undefined1 local_20a8 [8];
  AssertionResult gtest_ar;
  string local_2090;
  AssertHelper local_2070 [3];
  Message local_2058;
  int local_204c;
  undefined1 local_2048 [8];
  AssertionResult gtest_ar_;
  uint8_t signature [7856];
  uint8_t kContext [256];
  uint8_t local_79;
  uint8_t local_78 [7];
  uint8_t kMessage [1];
  uint8_t priv [64];
  uint8_t pub [32];
  SLHDSATest_BasicSignVerify_Test *this_local;
  
  SLHDSA_SHA2_128S_generate_key(priv + 0x38,local_78);
  local_79 = 'B';
  memset(signature + 0x1ea8,0,0x100);
  pcVar2 = (char *)0x0;
  local_204c = SLHDSA_SHA2_128S_sign
                         ((uint8_t *)&gtest_ar_.message_,local_78,&local_79,1,(uint8_t *)0x0,0);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_2048,&local_204c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2048);
  if (!bVar1) {
    testing::Message::Message(&local_2058);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2090,(internal *)local_2048,
               (AssertionResult *)
               "SLHDSA_SHA2_128S_sign(signature, priv, kMessage, sizeof(kMessage), nullptr, 0)",
               "false","true",pcVar2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_2070,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(local_2070,&local_2058);
    testing::internal::AssertHelper::~AssertHelper(local_2070);
    std::__cxx11::string::~string((string *)&local_2090);
    testing::Message::~Message(&local_2058);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2048);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_20ac = SLHDSA_SHA2_128S_verify
                           ((uint8_t *)&gtest_ar_.message_,0x1eb0,priv + 0x38,&local_79,1,
                            (uint8_t *)0x0,0);
    local_20b0 = 1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_20a8,
               "SLHDSA_SHA2_128S_verify(signature, sizeof(signature), pub, kMessage, sizeof(kMessage), nullptr, 0)"
               ,"1",&local_20ac,&local_20b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20a8);
    if (!bVar1) {
      testing::Message::Message(&local_20b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x46,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_20b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_20b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_20a8);
    local_20d4 = SLHDSA_SHA2_128S_verify
                           ((uint8_t *)&gtest_ar_.message_,0x1eb0,priv + 0x38,&local_79,1,
                            signature + 0x1ea8,1);
    local_20d8 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_20d0,
               "SLHDSA_SHA2_128S_verify(signature, sizeof(signature), pub, kMessage, sizeof(kMessage), kContext, 1)"
               ,"0",&local_20d4,&local_20d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20d0);
    if (!bVar1) {
      testing::Message::Message(&local_20e0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x49,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_20e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_20e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_20d0);
    local_20fc = SLHDSA_SHA2_128S_verify
                           ((uint8_t *)&gtest_ar_.message_,0x1eb0,priv + 0x38,&local_79,1,
                            signature + 0x1ea8,0x100);
    local_2100 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_20f8,
               "SLHDSA_SHA2_128S_verify(signature, sizeof(signature), pub, kMessage, sizeof(kMessage), kContext, 256)"
               ,"0",&local_20fc,&local_2100);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20f8);
    if (!bVar1) {
      testing::Message::Message(&local_2108);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x4c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_2108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_2108);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_20f8);
    pcVar2 = (char *)0x1;
    local_2124 = SLHDSA_SHA2_128S_sign
                           ((uint8_t *)&gtest_ar_.message_,local_78,&local_79,1,signature + 0x1ea8,1
                           );
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_2120,&local_2124,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2120);
    if (!bVar1) {
      testing::Message::Message(&local_2130);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_3.message_,(internal *)local_2120,
                 (AssertionResult *)
                 "SLHDSA_SHA2_128S_sign(signature, priv, kMessage, sizeof(kMessage), kContext, 1)",
                 "false","true",pcVar2);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2138,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x4f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2138,&local_2130);
      testing::internal::AssertHelper::~AssertHelper(&local_2138);
      std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_2130);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2120);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_216c = SLHDSA_SHA2_128S_verify
                             ((uint8_t *)&gtest_ar_.message_,0x1eb0,priv + 0x38,&local_79,1,
                              signature + 0x1ea8,1);
      local_2170 = 1;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_2168,
                 "SLHDSA_SHA2_128S_verify(signature, sizeof(signature), pub, kMessage, sizeof(kMessage), kContext, 1)"
                 ,"1",&local_216c,&local_2170);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2168);
      if (!bVar1) {
        testing::Message::Message(&local_2178);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2168);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                   ,0x52,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2180,&local_2178);
        testing::internal::AssertHelper::~AssertHelper(&local_2180);
        testing::Message::~Message(&local_2178);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2168);
    }
  }
  return;
}

Assistant:

TEST(SLHDSATest, BasicSignVerify) {
  uint8_t pub[SLHDSA_SHA2_128S_PUBLIC_KEY_BYTES];
  uint8_t priv[SLHDSA_SHA2_128S_PRIVATE_KEY_BYTES];
  SLHDSA_SHA2_128S_generate_key(pub, priv);

  uint8_t kMessage[] = {0x42};
  uint8_t kContext[256] = {0};
  uint8_t signature[SLHDSA_SHA2_128S_SIGNATURE_BYTES];
  ASSERT_TRUE(SLHDSA_SHA2_128S_sign(signature, priv, kMessage, sizeof(kMessage),
                                    nullptr, 0));
  EXPECT_EQ(SLHDSA_SHA2_128S_verify(signature, sizeof(signature), pub, kMessage,
                                    sizeof(kMessage), nullptr, 0),
            1);
  EXPECT_EQ(SLHDSA_SHA2_128S_verify(signature, sizeof(signature), pub, kMessage,
                                    sizeof(kMessage), kContext, 1),
            0);
  EXPECT_EQ(SLHDSA_SHA2_128S_verify(signature, sizeof(signature), pub, kMessage,
                                    sizeof(kMessage), kContext, 256),
            0);

  ASSERT_TRUE(SLHDSA_SHA2_128S_sign(signature, priv, kMessage, sizeof(kMessage),
                                    kContext, 1));
  EXPECT_EQ(SLHDSA_SHA2_128S_verify(signature, sizeof(signature), pub, kMessage,
                                    sizeof(kMessage), kContext, 1),
            1);
}